

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluDetectSpecialCaseCofs(word *pF,int nVars,int iVar)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int local_5c;
  int local_58 [6];
  ulong local_40;
  long local_38;
  
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  uVar2 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar2 = 1;
  }
  iVar1 = (int)uVar2;
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x41b,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  if (iVar < 6) {
    uVar8 = 0;
    uVar9 = 0;
    if (0 < iVar1) {
      uVar9 = uVar2;
    }
    local_58[1] = 0;
    local_58[2] = 0;
    local_5c = 0;
    local_40 = local_40 & 0xffffffff00000000;
    iVar5 = 0;
    local_58[0] = 0;
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      uVar2 = ~Truth6[iVar];
      uVar11 = (Truth6[iVar] & pF[uVar8]) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f);
      uVar12 = pF[uVar8] & uVar2;
      if (uVar12 == 0) {
        local_58[0] = local_58[0] + 1;
      }
      else if (uVar12 == uVar2) {
        local_58[1] = local_58[1] + 1;
      }
      else if (uVar11 == 0) {
        local_58[2] = local_58[2] + 1;
      }
      else if (uVar11 == uVar2) {
        local_5c = local_5c + 1;
      }
      else if ((uVar11 ^ uVar12) == 0xffffffffffffffff) {
        local_40 = CONCAT44(local_40._4_4_,(int)local_40 + 1);
      }
      else {
        iVar5 = iVar5 + (uint)(uVar12 == uVar11);
      }
    }
    local_58[5] = iVar5;
    local_58[4] = (int)local_40;
    local_58[3] = local_5c;
  }
  else {
    bVar7 = (byte)iVar - 6;
    uVar3 = 1 << (bVar7 & 0x1f);
    iVar6 = 2 << (bVar7 & 0x1f);
    local_58[4] = 0;
    uVar2 = 0;
    if (0 < (int)uVar3) {
      uVar2 = (ulong)uVar3;
    }
    local_40 = (long)iVar6 * 8;
    local_38 = (long)(int)uVar3 * 8;
    iVar5 = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[1] = 0;
    local_58[0] = 0;
    for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + iVar6) {
      for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        uVar8 = pF[uVar9];
        if (uVar8 == 0xffffffffffffffff) {
          local_58[1] = local_58[1] + 1;
        }
        else if (uVar8 == 0) {
          local_58[0] = local_58[0] + 1;
        }
        else {
          uVar11 = pF[(long)(int)uVar3 + uVar9];
          if (uVar11 == 0xffffffffffffffff) {
            local_58[3] = local_58[3] + 1;
          }
          else if (uVar11 == 0) {
            local_58[2] = local_58[2] + 1;
          }
          else if ((uVar11 ^ uVar8) == 0xffffffffffffffff) {
            local_58[4] = local_58[4] + 1;
          }
          else {
            iVar5 = iVar5 + (uint)(uVar8 == uVar11);
          }
        }
      }
      pF = pF + iVar6;
    }
    local_58[5] = iVar5;
    iVar1 = iVar1 / 2;
  }
  if (iVar5 != iVar1) {
    lVar4 = 0;
    while( true ) {
      if (lVar4 == 5) {
        return -1;
      }
      iVar6 = local_58[lVar4];
      if (iVar6 != iVar1 && iVar1 <= iVar6) break;
      if (iVar6 == iVar1) {
        return (int)lVar4;
      }
      lVar4 = lVar4 + 1;
    }
    __assert_fail("State[i] <= nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x450,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  __assert_fail("State[5] != nWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                ,0x44d,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
}

Assistant:

int If_CluDetectSpecialCaseCofs( word * pF, int nVars, int iVar )
{
    word Cof0, Cof1;
    int State[6] = {0};
    int i, nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
        {
            Cof0 =  (pF[i] & ~Truth6[iVar]);
            Cof1 = ((pF[i] &  Truth6[iVar]) >> Shift);

            if ( Cof0 == 0 )
                State[0]++;
            else if ( Cof0 == ~Truth6[iVar] )
                State[1]++;
            else if ( Cof1 == 0 )
                State[2]++;
            else if ( Cof1 == ~Truth6[iVar] )
                State[3]++;
            else if ( Cof0 == ~Cof1 )
                State[4]++;
            else if ( Cof0 == Cof1 )
                State[5]++;
        }
    }
    else
    {
        int k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Cof0 = pF[i];
                Cof1 = pF[Step+i];

                if ( Cof0 == 0 )
                    State[0]++;
                else if ( Cof0 == ~(word)0 )
                    State[1]++;
                else if ( Cof1 == 0 )
                    State[2]++;
                else if ( Cof1 == ~(word)0 )
                    State[3]++;
                else if ( Cof0 == ~Cof1 )
                    State[4]++;
                else if ( Cof0 == Cof1 )
                    State[5]++;
            }
            pF    += 2*Step;
        }
        nWords /= 2;
    }
    assert( State[5] != nWords );
    for ( i = 0; i < 5; i++ )
    {
        assert( State[i] <= nWords );
        if ( State[i] == nWords )
            return i;
    }
    return -1;
}